

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

Token * __thiscall lexer::Lexer::NextToken(Token *__return_storage_ptr__,Lexer *this)

{
  string *this_00;
  byte c;
  char cVar1;
  int iVar2;
  iterator iVar3;
  _Alloc_hider _Var4;
  string literal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  long *local_330;
  long local_328;
  long local_320 [2];
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  undefined8 local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  undefined8 local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  __return_storage_ptr__->_vptr_Token = (_func_int **)&PTR__Token_001248c8;
  this_00 = &__return_storage_ptr__->Literal;
  local_338 = &(__return_storage_ptr__->Literal).field_2;
  (__return_storage_ptr__->Literal)._M_dataplus._M_p = (pointer)local_338;
  (__return_storage_ptr__->Literal)._M_string_length = 0;
  (__return_storage_ptr__->Literal).field_2._M_local_buf[0] = '\0';
  do {
    c = this->curChar;
    if (0x1f < c) {
      switch(c) {
      case 0x20:
        goto switchD_0010eaa0_caseD_20;
      case 0x21:
        cVar1 = peekChar(this);
        if (cVar1 != '=') {
          local_170.field_2._M_local_buf[0] = this->curChar;
          local_170._M_string_length = 1;
          local_170.field_2._M_local_buf[1] = '\0';
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          Operator::Operator((Operator *)local_388,BANG,&local_170);
          __return_storage_ptr__->Type = local_388._8_4_;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,local_378);
          Operator::~Operator((Operator *)local_388);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p == &local_170.field_2) goto LAB_0010f797;
          local_3a8.field_2._M_allocated_capacity =
               CONCAT62(local_170.field_2._M_allocated_capacity._2_6_,
                        CONCAT11(local_170.field_2._M_local_buf[1],local_170.field_2._M_local_buf[0]
                                ));
          _Var4._M_p = local_170._M_dataplus._M_p;
          goto LAB_0010f78f;
        }
        cVar1 = this->curChar;
        readChar(this);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,cVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,this->curChar);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,local_3a8._M_dataplus._M_p,
                   local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
        Operator::Operator((Operator *)local_388,NOT_EQ,&local_2d0);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        local_290.field_2._M_allocated_capacity = local_2d0.field_2._M_allocated_capacity;
        _Var4._M_p = local_2d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
LAB_0010f2c4:
          operator_delete(_Var4._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        break;
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
        goto switchD_0010eaa0_caseD_22;
      case 0x28:
        local_1f0.field_2._M_allocated_capacity._0_2_ = 0x28;
        local_1f0._M_string_length = 1;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        Symbol::Symbol((Symbol *)local_388,LPAREN,&local_1f0);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Symbol::~Symbol((Symbol *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) goto LAB_0010f797;
        local_3a8.field_2._M_allocated_capacity =
             CONCAT62(local_1f0.field_2._M_allocated_capacity._2_6_,
                      local_1f0.field_2._M_allocated_capacity._0_2_);
        _Var4._M_p = local_1f0._M_dataplus._M_p;
        goto LAB_0010f78f;
      case 0x29:
        local_210.field_2._M_allocated_capacity._0_2_ = 0x29;
        local_210._M_string_length = 1;
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        Symbol::Symbol((Symbol *)local_388,RPAREN,&local_210);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Symbol::~Symbol((Symbol *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_0010f797;
        local_3a8.field_2._M_allocated_capacity =
             CONCAT62(local_210.field_2._M_allocated_capacity._2_6_,
                      local_210.field_2._M_allocated_capacity._0_2_);
        _Var4._M_p = local_210._M_dataplus._M_p;
        goto LAB_0010f78f;
      case 0x2a:
        local_d0.field_2._M_allocated_capacity._0_2_ = 0x2a;
        local_d0._M_string_length = 1;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        Operator::Operator((Operator *)local_388,ASTERISK,&local_d0);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0010f797;
        local_3a8.field_2._M_allocated_capacity =
             CONCAT62(local_d0.field_2._M_allocated_capacity._2_6_,
                      local_d0.field_2._M_allocated_capacity._0_2_);
        _Var4._M_p = local_d0._M_dataplus._M_p;
        goto LAB_0010f78f;
      case 0x2b:
        local_90.field_2._M_allocated_capacity._0_2_ = 0x2b;
        local_90._M_string_length = 1;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        Operator::Operator((Operator *)local_388,PLUS,&local_90);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0010f797;
        local_3a8.field_2._M_allocated_capacity =
             CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,
                      local_90.field_2._M_allocated_capacity._0_2_);
        _Var4._M_p = local_90._M_dataplus._M_p;
        goto LAB_0010f78f;
      case 0x2c:
        local_190.field_2._M_allocated_capacity._0_2_ = 0x2c;
        local_190._M_string_length = 1;
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        Symbol::Symbol((Symbol *)local_388,COMMA,&local_190);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Symbol::~Symbol((Symbol *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_0010f797;
        local_3a8.field_2._M_allocated_capacity =
             CONCAT62(local_190.field_2._M_allocated_capacity._2_6_,
                      local_190.field_2._M_allocated_capacity._0_2_);
        _Var4._M_p = local_190._M_dataplus._M_p;
        goto LAB_0010f78f;
      case 0x2d:
        local_b0.field_2._M_allocated_capacity._0_2_ = 0x2d;
        local_b0._M_string_length = 1;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        Operator::Operator((Operator *)local_388,MINUS,&local_b0);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_0010f797;
        local_3a8.field_2._M_allocated_capacity =
             CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                      local_b0.field_2._M_allocated_capacity._0_2_);
        _Var4._M_p = local_b0._M_dataplus._M_p;
        goto LAB_0010f78f;
      case 0x2e:
        cVar1 = peekChar(this);
        if (cVar1 != '.') {
          local_40._M_local_buf[0] = this->curChar;
          local_48 = 1;
          local_40._M_local_buf[1] = '\0';
          local_388._0_8_ = &PTR__Token_001248c8;
          local_388._8_4_ = INVALID;
          local_378[0]._M_dataplus._M_p = (pointer)&local_378[0].field_2;
          local_50 = &local_40;
          std::__cxx11::string::_M_construct<char*>((string *)local_378,&local_40);
          __return_storage_ptr__->Type = local_388._8_4_;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,local_378);
          local_388._0_8_ = &PTR__Token_001248c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378[0]._M_dataplus._M_p != &local_378[0].field_2) {
            operator_delete(local_378[0]._M_dataplus._M_p,
                            local_378[0].field_2._M_allocated_capacity + 1);
          }
          if (local_50 == &local_40) goto LAB_0010f797;
          local_3a8.field_2._M_allocated_capacity =
               CONCAT62(local_40._M_allocated_capacity._2_6_,
                        CONCAT11(local_40._M_local_buf[1],local_40._M_local_buf[0]));
          _Var4._M_p = (pointer)local_50;
          goto LAB_0010f78f;
        }
        cVar1 = this->curChar;
        readChar(this);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,cVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,this->curChar);
        local_330 = local_320;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,local_3a8._M_dataplus._M_p,
                   local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
        local_388._0_8_ = &PTR__Token_001248c8;
        local_388._8_4_ = RANGE;
        local_378[0]._M_dataplus._M_p = (pointer)&local_378[0].field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_378,local_330,local_328 + (long)local_330);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        local_388._0_8_ = &PTR__Token_001248c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378[0]._M_dataplus._M_p != &local_378[0].field_2) {
          operator_delete(local_378[0]._M_dataplus._M_p,
                          local_378[0].field_2._M_allocated_capacity + 1);
        }
        if (local_330 != local_320) {
          operator_delete(local_330,local_320[0] + 1);
        }
        _Var4._M_p = local_3a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) goto LAB_0010f78f;
        goto LAB_0010f797;
      case 0x2f:
        local_f0.field_2._M_allocated_capacity._0_2_ = 0x2f;
        local_f0._M_string_length = 1;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        Operator::Operator((Operator *)local_388,DIV,&local_f0);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0010f797;
        local_3a8.field_2._M_allocated_capacity =
             CONCAT62(local_f0.field_2._M_allocated_capacity._2_6_,
                      local_f0.field_2._M_allocated_capacity._0_2_);
        _Var4._M_p = local_f0._M_dataplus._M_p;
        goto LAB_0010f78f;
      case 0x3c:
        cVar1 = peekChar(this);
        if (cVar1 != '=') {
          local_110.field_2._M_local_buf[0] = this->curChar;
          local_110._M_string_length = 1;
          local_110.field_2._M_local_buf[1] = '\0';
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          Operator::Operator((Operator *)local_388,LT,&local_110);
          __return_storage_ptr__->Type = local_388._8_4_;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,local_378);
          Operator::~Operator((Operator *)local_388);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_0010f797;
          local_3a8.field_2._M_allocated_capacity =
               CONCAT62(local_110.field_2._M_allocated_capacity._2_6_,
                        CONCAT11(local_110.field_2._M_local_buf[1],local_110.field_2._M_local_buf[0]
                                ));
          _Var4._M_p = local_110._M_dataplus._M_p;
          goto LAB_0010f78f;
        }
        cVar1 = this->curChar;
        readChar(this);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,cVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,this->curChar);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_3a8._M_dataplus._M_p,
                   local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
        Operator::Operator((Operator *)local_388,LT_EQ,&local_270);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        local_290.field_2._M_allocated_capacity = local_270.field_2._M_allocated_capacity;
        _Var4._M_p = local_270._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) goto LAB_0010f2c4;
        break;
      case 0x3d:
        cVar1 = peekChar(this);
        if (cVar1 != '=') {
          local_150.field_2._M_local_buf[0] = this->curChar;
          local_150._M_string_length = 1;
          local_150.field_2._M_local_buf[1] = '\0';
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          Operator::Operator((Operator *)local_388,ASSIGN,&local_150);
          __return_storage_ptr__->Type = local_388._8_4_;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,local_378);
          Operator::~Operator((Operator *)local_388);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_0010f797;
          local_3a8.field_2._M_allocated_capacity =
               CONCAT62(local_150.field_2._M_allocated_capacity._2_6_,
                        CONCAT11(local_150.field_2._M_local_buf[1],local_150.field_2._M_local_buf[0]
                                ));
          _Var4._M_p = local_150._M_dataplus._M_p;
          goto LAB_0010f78f;
        }
        cVar1 = this->curChar;
        readChar(this);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,cVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,this->curChar);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,local_3a8._M_dataplus._M_p,
                   local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
        Operator::Operator((Operator *)local_388,EQ,&local_2b0);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        local_290.field_2._M_allocated_capacity = local_2b0.field_2._M_allocated_capacity;
        _Var4._M_p = local_2b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) goto LAB_0010f2c4;
        break;
      case 0x3e:
        cVar1 = peekChar(this);
        if (cVar1 != '=') {
          local_130.field_2._M_local_buf[0] = this->curChar;
          local_130._M_string_length = 1;
          local_130.field_2._M_local_buf[1] = '\0';
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          Operator::Operator((Operator *)local_388,GT,&local_130);
          __return_storage_ptr__->Type = local_388._8_4_;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,local_378);
          Operator::~Operator((Operator *)local_388);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_0010f797;
          local_3a8.field_2._M_allocated_capacity =
               CONCAT62(local_130.field_2._M_allocated_capacity._2_6_,
                        CONCAT11(local_130.field_2._M_local_buf[1],local_130.field_2._M_local_buf[0]
                                ));
          _Var4._M_p = local_130._M_dataplus._M_p;
          goto LAB_0010f78f;
        }
        cVar1 = this->curChar;
        readChar(this);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,cVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_3a8,this->curChar);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,local_3a8._M_dataplus._M_p,
                   local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
        Operator::Operator((Operator *)local_388,GT_EQ,&local_290);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Operator::~Operator((Operator *)local_388);
        _Var4._M_p = local_290._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) goto LAB_0010f2c4;
        break;
      default:
        if (c == 0x7b) {
          local_1b0.field_2._M_allocated_capacity._0_2_ = 0x7b;
          local_1b0._M_string_length = 1;
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          Symbol::Symbol((Symbol *)local_388,LBRACE,&local_1b0);
          __return_storage_ptr__->Type = local_388._8_4_;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,local_378);
          Symbol::~Symbol((Symbol *)local_388);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_0010f797;
          local_3a8.field_2._M_allocated_capacity =
               CONCAT62(local_1b0.field_2._M_allocated_capacity._2_6_,
                        local_1b0.field_2._M_allocated_capacity._0_2_);
          _Var4._M_p = local_1b0._M_dataplus._M_p;
        }
        else {
          if (c != 0x7d) goto switchD_0010eaa0_caseD_22;
          local_1d0.field_2._M_allocated_capacity._0_2_ = 0x7d;
          local_1d0._M_string_length = 1;
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          Symbol::Symbol((Symbol *)local_388,RBRACE,&local_1d0);
          __return_storage_ptr__->Type = local_388._8_4_;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (this_00,local_378);
          Symbol::~Symbol((Symbol *)local_388);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) goto LAB_0010f797;
          local_3a8.field_2._M_allocated_capacity =
               CONCAT62(local_1d0.field_2._M_allocated_capacity._2_6_,
                        local_1d0.field_2._M_allocated_capacity._0_2_);
          _Var4._M_p = local_1d0._M_dataplus._M_p;
        }
        goto LAB_0010f78f;
      }
      _Var4._M_p = local_3a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) goto LAB_0010f78f;
      goto LAB_0010f797;
    }
    if (c < 10) {
      if (c != 9) break;
    }
    else if (c != 0xd) {
      if (c != 10) goto switchD_0010eaa0_caseD_22;
      local_70.field_2._M_allocated_capacity._0_2_ = 10;
      local_70._M_string_length = 1;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      Symbol::Symbol((Symbol *)local_388,NEWLINE,&local_70);
      __return_storage_ptr__->Type = local_388._8_4_;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (this_00,local_378);
      Symbol::~Symbol((Symbol *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,
                                 local_70.field_2._M_allocated_capacity._0_2_) + 1);
      }
      this->line = this->line + 1;
      goto LAB_0010f797;
    }
switchD_0010eaa0_caseD_20:
    readChar(this);
  } while( true );
  if (c == 0) {
    local_220._M_allocated_capacity._0_2_ = 0;
    local_228 = 1;
    local_388._0_8_ = &PTR__Token_001248c8;
    local_388._8_4_ = EOB;
    local_378[0]._M_dataplus._M_p = (pointer)&local_378[0].field_2;
    local_230 = &local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_378,&local_220,local_220._M_local_buf + 1);
    __return_storage_ptr__->Type = local_388._8_4_;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this_00,local_378);
    local_388._0_8_ = &PTR__Token_001248c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378[0]._M_dataplus._M_p != &local_378[0].field_2) {
      operator_delete(local_378[0]._M_dataplus._M_p,local_378[0].field_2._M_allocated_capacity + 1);
    }
    if (local_230 == &local_220) goto LAB_0010f797;
    local_3a8.field_2._M_allocated_capacity =
         CONCAT62(local_220._M_allocated_capacity._2_6_,local_220._M_allocated_capacity._0_2_);
    _Var4._M_p = (pointer)local_230;
  }
  else {
switchD_0010eaa0_caseD_22:
    iVar2 = isalpha((int)(char)c);
    if ((c == 0x5f) || (iVar2 != 0)) {
      readIdent_abi_cxx11_(&local_3a8,this);
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&keywords_abi_cxx11_._M_h,&local_3a8);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_3a8._M_dataplus._M_p,
                   local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
        Word::Word((Word *)local_388,ID,&local_2f0);
        __return_storage_ptr__->Type = local_388._8_4_;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,local_378);
        Word::~Word((Word *)local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        __return_storage_ptr__->Type =
             *(TokenType *)
              ((long)iVar3.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_true>
                     ._M_cur + 0x30);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_token::Token>,_true>
                                  ._M_cur + 0x38));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p == &local_3a8.field_2) {
        return __return_storage_ptr__;
      }
LAB_0010f8ee:
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    if ((int)(char)c - 0x30U < 10) {
      readInt_abi_cxx11_((string *)local_388,this);
      iVar2 = std::__cxx11::stoi((string *)local_388,(size_t *)0x0,10);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388._0_8_ !=
          local_378) {
        operator_delete((void *)local_388._0_8_,(ulong)(local_378[0]._M_dataplus._M_p + 1));
      }
      Num::Num((Num *)local_388,iVar2);
      __return_storage_ptr__->Type = local_388._8_4_;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (this_00,local_378);
      local_388._0_8_ = &PTR__Token_001248c8;
      local_3a8.field_2._M_allocated_capacity = local_378[0].field_2._M_allocated_capacity;
      local_3a8._M_dataplus._M_p = local_378[0]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378[0]._M_dataplus._M_p == &local_378[0].field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0010f8ee;
    }
    if ((c == 0x27) || (c == 0x22)) {
      readStringLiteral_abi_cxx11_(&local_3a8,this,c);
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_310,local_3a8._M_dataplus._M_p,
                 local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
      Word::Word((Word *)local_388,LITERAL,&local_310);
      __return_storage_ptr__->Type = local_388._8_4_;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (this_00,local_378);
      Word::~Word((Word *)local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      _Var4._M_p = local_3a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p == &local_3a8.field_2) goto LAB_0010f797;
    }
    else {
      local_248 = 1;
      local_240._M_local_buf[1] = '\0';
      local_388._0_8_ = &PTR__Token_001248c8;
      local_388._8_4_ = INVALID;
      local_378[0]._M_dataplus._M_p = (pointer)&local_378[0].field_2;
      local_250 = &local_240;
      local_240._M_local_buf[0] = c;
      std::__cxx11::string::_M_construct<char*>((string *)local_378,&local_240);
      __return_storage_ptr__->Type = local_388._8_4_;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (this_00,local_378);
      local_388._0_8_ = &PTR__Token_001248c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378[0]._M_dataplus._M_p != &local_378[0].field_2) {
        operator_delete(local_378[0]._M_dataplus._M_p,local_378[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_250 == &local_240) goto LAB_0010f797;
      local_3a8.field_2._M_allocated_capacity =
           CONCAT62(local_240._M_allocated_capacity._2_6_,
                    CONCAT11(local_240._M_local_buf[1],local_240._M_local_buf[0]));
      _Var4._M_p = (pointer)local_250;
    }
  }
LAB_0010f78f:
  operator_delete(_Var4._M_p,local_3a8.field_2._M_allocated_capacity + 1);
LAB_0010f797:
  readChar(this);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::NextToken()
{
    Token tok;
    skipWhiteSpace();

    switch (curChar) {
    case '.':
        if (peekChar() == '.'){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Token(TokenType::RANGE, literal);
        }else{
            tok = Token(TokenType::INVALID, std::string(1, curChar));
        }
        break;
    case '\n':
        tok = Symbol(TokenType::NEWLINE, std::string(1, curChar));
        line++;
        break;
    case '+':
        tok = Operator(TokenType::PLUS, std::string(1, curChar));
        break;
    case '-':
        tok = Operator(TokenType::MINUS, std::string(1, curChar));
        break;
    case '*':
        tok = Operator(TokenType::ASTERISK, std::string(1, curChar));
        break;
    case '/':
        tok = Operator(TokenType::DIV, std::string(1, curChar));
        break;
    case '<':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::LT_EQ, literal);
        }else{
            tok = Operator(TokenType::LT, std::string(1, curChar));
        }
        break;
    case '>':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::GT_EQ, literal);
        }else{
            tok = Operator(TokenType::GT, std::string(1, curChar));
        }

        break;
    case '=':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::EQ, literal);
        }else{
            tok = Operator(TokenType::ASSIGN, std::string(1, curChar));
        }
        break;
    case '!':
        if (peekChar() == '='){
            char ch = curChar;
            readChar();
            std::string literal = "";
            literal += ch;
            literal += curChar;
            tok = Operator(TokenType::NOT_EQ, literal);
        }else{
            tok = Operator(TokenType::BANG, std::string(1, curChar));
        }
        break;
    case ',':
        tok = Symbol(TokenType::COMMA, std::string(1, curChar));
        break;
    case '{':
        tok = Symbol(TokenType::LBRACE, std::string(1, curChar));
        break;
    case '}':
        tok = Symbol(TokenType::RBRACE, std::string(1, curChar));
        break;
    case '(':
        tok = Symbol(TokenType::LPAREN, std::string(1, curChar));
        break;
    case ')':
        tok = Symbol(TokenType::RPAREN, std::string(1, curChar));
        break;
    case '\0':
        tok = Token(TokenType::EOB, std::string(1, curChar));
        break;
    default:
        if (isLetter(curChar)){
            std::string literal = readIdent();
            auto wsrch = Lexer::keywords.find(literal);
            if(wsrch != Lexer::keywords.end())
                tok  = wsrch->second;
            else
                tok = Word(TokenType::ID, literal);
            return tok;
        }else if (isDigit(curChar)){
            int val = std::stoi(readInt());
            tok = Num(val);
            return tok;
        }else if(curChar == '\'' || curChar == '"'){
            std::string literal = readStringLiteral(curChar);
            tok = Word(TokenType::LITERAL, literal);
        }
        else{
           tok = Token(TokenType::INVALID, std::string(1, curChar));
        }

    }
    readChar();
    return tok;
}